

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_targetCBlockSize_body
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,size_t bss,
                 U32 lastBlock)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t err_code;
  size_t maxCSize;
  size_t cSize;
  size_t bss_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  if (bss == 0) {
    if (((zc->isFirstBlock == 0) && (iVar1 = ZSTD_maybeRLE(&zc->seqStore), iVar1 != 0)) &&
       (iVar1 = ZSTD_isRLE((BYTE *)src,srcSize), iVar1 != 0)) {
      sVar3 = ZSTD_rleCompressBlock(dst,dstCapacity,*src,srcSize,lastBlock);
      return sVar3;
    }
    sVar3 = ZSTD_compressSuperBlock(zc,dst,dstCapacity,src,srcSize,lastBlock);
    if (sVar3 != 0xffffffffffffffba) {
      sVar4 = ZSTD_minGain(srcSize,(zc->appliedParams).cParams.strategy);
      uVar2 = ERR_isError(sVar3);
      if (uVar2 != 0) {
        return sVar3;
      }
      if ((sVar3 != 0) && (sVar3 < (srcSize - sVar4) + 3)) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return sVar3;
      }
    }
  }
  sVar3 = ZSTD_noCompressBlock(dst,dstCapacity,src,srcSize,lastBlock);
  return sVar3;
}

Assistant:

static size_t ZSTD_compressBlock_targetCBlockSize_body(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               const size_t bss, U32 lastBlock)
{
    DEBUGLOG(6, "Attempting ZSTD_compressSuperBlock()");
    if (bss == ZSTDbss_compress) {
        if (/* We don't want to emit our first block as a RLE even if it qualifies because
            * doing so will cause the decoder (cli only) to throw a "should consume all input error."
            * This is only an issue for zstd <= v1.4.3
            */
            !zc->isFirstBlock &&
            ZSTD_maybeRLE(&zc->seqStore) &&
            ZSTD_isRLE((BYTE const*)src, srcSize))
        {
            return ZSTD_rleCompressBlock(dst, dstCapacity, *(BYTE const*)src, srcSize, lastBlock);
        }
        /* Attempt superblock compression.
         *
         * Note that compressed size of ZSTD_compressSuperBlock() is not bound by the
         * standard ZSTD_compressBound(). This is a problem, because even if we have
         * space now, taking an extra byte now could cause us to run out of space later
         * and violate ZSTD_compressBound().
         *
         * Define blockBound(blockSize) = blockSize + ZSTD_blockHeaderSize.
         *
         * In order to respect ZSTD_compressBound() we must attempt to emit a raw
         * uncompressed block in these cases:
         *   * cSize == 0: Return code for an uncompressed block.
         *   * cSize == dstSize_tooSmall: We may have expanded beyond blockBound(srcSize).
         *     ZSTD_noCompressBlock() will return dstSize_tooSmall if we are really out of
         *     output space.
         *   * cSize >= blockBound(srcSize): We have expanded the block too much so
         *     emit an uncompressed block.
         */
        {
            size_t const cSize = ZSTD_compressSuperBlock(zc, dst, dstCapacity, src, srcSize, lastBlock);
            if (cSize != ERROR(dstSize_tooSmall)) {
                size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, zc->appliedParams.cParams.strategy);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressSuperBlock failed");
                if (cSize != 0 && cSize < maxCSize + ZSTD_blockHeaderSize) {
                    ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
                    return cSize;
                }
            }
        }
    }

    DEBUGLOG(6, "Resorting to ZSTD_noCompressBlock()");
    /* Superblock compression failed, attempt to emit a single no compress block.
     * The decoder will be able to stream this block since it is uncompressed.
     */
    return ZSTD_noCompressBlock(dst, dstCapacity, src, srcSize, lastBlock);
}